

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::log_internal::Encode32Bit
          (log_internal *this,uint64_t tag,uint32_t value,Span<char> *buf)

{
  undefined1 *puVar1;
  Span<char> *pSVar2;
  anon_unknown_1 *this_00;
  undefined1 *puVar3;
  bool bVar4;
  Span<char> *pSVar5;
  ulong uVar6;
  Span<char> *pSVar7;
  Span<char> *buf_00;
  Span<char> *pSVar8;
  Span<char> *pSVar9;
  undefined1 *puVar10;
  Span<char> *pSVar11;
  size_type sVar12;
  anon_unknown_1 *paVar13;
  undefined4 in_register_00000014;
  long *size;
  Span<char> *this_01;
  Span<char> *extraout_RDX;
  undefined8 *size_00;
  ulong uVar14;
  Span<char> *__src;
  uint64_t uVar15;
  Span<char> *pSVar16;
  pointer __dest;
  undefined1 uVar17;
  uint64_t uVar18;
  Span<char> *this_02;
  
  size = (long *)CONCAT44(in_register_00000014,value);
  uVar14 = tag & 0xffffffff;
  pSVar11 = (Span<char> *)((long)this * 8 + 5);
  __src = (Span<char> *)0x1;
  pSVar5 = pSVar11;
  if (0x7f < (ulong)((long)this << 3)) {
    do {
      buf = (Span<char> *)((ulong)pSVar5 >> 7);
      __src = (Span<char> *)((long)&__src->ptr_ + 1);
      bVar4 = (Span<char> *)0x3fff < pSVar5;
      pSVar5 = buf;
    } while (bVar4);
  }
  puVar1 = (undefined1 *)((long)&__src->ptr_ + 4);
  puVar3 = (undefined1 *)size[1];
  if (puVar3 < puVar1) {
    puVar10 = (undefined1 *)0x0;
  }
  else {
    anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)pSVar11,(uint64_t)__src,(size_t)size,buf);
    uVar6 = 0;
    do {
      if ((ulong)size[1] <= uVar6) {
        Encode32Bit();
        goto LAB_001014c9;
      }
      buf = (Span<char> *)*size;
      *(char *)((long)&buf->ptr_ + uVar6) = (char)uVar14;
      uVar14 = uVar14 >> 8;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 4);
    buf = (Span<char> *)size[1];
    if (buf < (Span<char> *)0x4) {
LAB_001014c9:
      Encode32Bit();
      pSVar5 = (Span<char> *)((long)pSVar11 * 8 + 2);
      uVar18 = 1;
      uVar15 = 1;
      pSVar16 = pSVar5;
      pSVar7 = buf;
      if (0x7f < (ulong)((long)pSVar11 << 3)) {
        do {
          pSVar7 = (Span<char> *)((ulong)pSVar16 >> 7);
          uVar15 = uVar15 + 1;
          bVar4 = (Span<char> *)0x3fff < pSVar16;
          pSVar16 = pSVar7;
        } while (bVar4);
      }
      if ((Span<char> *)0x7f < this_01) {
        uVar18 = 1;
        pSVar11 = this_01;
        do {
          pSVar7 = (Span<char> *)((ulong)pSVar11 >> 7);
          uVar18 = uVar18 + 1;
          bVar4 = (Span<char> *)0x3fff < pSVar11;
          pSVar11 = pSVar7;
        } while (bVar4);
      }
      uVar6 = (long)&this_01->ptr_ + uVar18 + uVar15;
      uVar14 = buf->len_;
      if (uVar14 < uVar6) {
        pSVar11 = (Span<char> *)0x0;
      }
      else {
        anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)pSVar5,uVar15,(size_t)buf,pSVar7);
        anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)this_01,uVar18,(size_t)buf,pSVar7);
        __dest = buf->ptr_;
        memcpy(__dest,__src,(size_t)this_01);
        pSVar11 = (Span<char> *)((long)buf->len_ - (long)this_01);
        if ((Span<char> *)buf->len_ < this_01) {
          EncodeBytes();
          pSVar5 = (Span<char> *)((long)__dest * 8 + 2);
          uVar15 = 1;
          pSVar16 = (Span<char> *)0x1;
          pSVar7 = pSVar5;
          buf_00 = pSVar11;
          if (0x7f < (ulong)((long)__dest << 3)) {
            do {
              buf_00 = (Span<char> *)((ulong)pSVar7 >> 7);
              pSVar16 = (Span<char> *)((long)&pSVar16->ptr_ + 1);
              bVar4 = (Span<char> *)0x3fff < pSVar7;
              pSVar7 = buf_00;
            } while (bVar4);
          }
          pSVar7 = (Span<char> *)pSVar11->len_;
          pSVar8 = extraout_RDX;
          if (pSVar7 < extraout_RDX) {
            pSVar8 = pSVar7;
          }
          if ((Span<char> *)0x7f < pSVar8) {
            uVar15 = 1;
            do {
              buf_00 = (Span<char> *)((ulong)pSVar8 >> 7);
              uVar15 = uVar15 + 1;
              bVar4 = (Span<char> *)0x3fff < pSVar8;
              pSVar8 = buf_00;
            } while (bVar4);
          }
          pSVar8 = (Span<char> *)((long)&pSVar16->ptr_ + uVar15);
          this_02 = extraout_RDX;
          if (((pSVar8 <= pSVar7) &&
              (pSVar2 = (Span<char> *)((long)&pSVar8->ptr_ + (long)&extraout_RDX->ptr_),
              pSVar9 = (Span<char> *)((long)pSVar2 - (long)pSVar7),
              pSVar7 <= pSVar2 && pSVar9 != (Span<char> *)0x0)) &&
             (this_02 = (Span<char> *)((long)extraout_RDX - (long)pSVar9), extraout_RDX < pSVar9)) {
LAB_00101698:
            EncodeBytesTruncate();
            this_00 = (anon_unknown_1 *)((long)pSVar5 * 8 + 2);
            uVar18 = 1;
            uVar15 = 1;
            paVar13 = this_00;
            if (0x7f < (ulong)((long)pSVar5 << 3)) {
              do {
                uVar15 = uVar15 + 1;
                bVar4 = (anon_unknown_1 *)0x3fff < paVar13;
                paVar13 = (anon_unknown_1 *)((ulong)paVar13 >> 7);
              } while (bVar4);
            }
            pSVar11 = (Span<char> *)size_00[1];
            if (pSVar11 < pSVar16) {
              pSVar16 = pSVar11;
            }
            if ((Span<char> *)0x7f < pSVar16) {
              uVar18 = 1;
              do {
                uVar18 = uVar18 + 1;
                bVar4 = (Span<char> *)0x3fff < pSVar16;
                pSVar16 = (Span<char> *)((ulong)pSVar16 >> 7);
              } while (bVar4);
            }
            if (pSVar11 < (Span<char> *)(uVar18 + uVar15)) {
              size_00[1] = 0;
              uVar17 = 0;
            }
            else {
              anon_unknown_1::EncodeRawVarint(this_00,uVar15,(size_t)size_00,pSVar11);
              uVar17 = (undefined1)*size_00;
              anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)0x0,uVar18,(size_t)size_00,pSVar11);
            }
            return (bool)uVar17;
          }
          pSVar8 = (Span<char> *)((long)&this_02->ptr_ + (long)&pSVar8->ptr_);
          if (pSVar7 < pSVar8) {
            sVar12 = 0;
          }
          else {
            anon_unknown_1::EncodeRawVarint
                      ((anon_unknown_1 *)pSVar5,(uint64_t)pSVar16,(size_t)pSVar11,buf_00);
            anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)this_02,uVar15,(size_t)pSVar11,buf_00)
            ;
            pSVar5 = (Span<char> *)pSVar11->ptr_;
            memcpy(pSVar5,__src,(size_t)this_02);
            sVar12 = (long)pSVar11->len_ - (long)this_02;
            if ((Span<char> *)pSVar11->len_ < this_02) {
              EncodeBytesTruncate();
              pSVar16 = __src;
              goto LAB_00101698;
            }
            pSVar11->ptr_ = (pointer)((long)&this_02->ptr_ + (long)pSVar11->ptr_);
          }
          pSVar11->len_ = sVar12;
          return pSVar8 <= pSVar7;
        }
        buf->ptr_ = (pointer)((long)&this_01->ptr_ + (long)buf->ptr_);
      }
      buf->len_ = (size_type)pSVar11;
      return uVar6 <= uVar14;
    }
    *size = *size + 4;
    puVar10 = (undefined1 *)((long)&buf[-1].len_ + 4);
  }
  size[1] = (long)puVar10;
  return puVar1 <= puVar3;
}

Assistant:

bool Encode32Bit(uint64_t tag, uint32_t value, absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::k32Bit);
  const size_t tag_type_size = VarintSize(tag_type);
  if (tag_type_size + sizeof(value) > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  for (size_t s = 0; s < sizeof(value); s++) {
    (*buf)[s] = static_cast<char>(value & 0xff);
    value >>= 8;
  }
  buf->remove_prefix(sizeof(value));
  return true;
}